

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_section.hpp
# Opt level: O2

bool __thiscall
ELFIO::section_impl<ELFIO::Elf64_Shdr>::load_data(section_impl<ELFIO::Elf64_Shdr> *this)

{
  unique_ptr<char[],_std::default_delete<char[]>_> *this_00;
  int iVar1;
  ulong uVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  pointer __p;
  bool bVar4;
  streampos sVar5;
  ulong uVar3;
  
  uVar2 = (this->header).sh_offset;
  uVar3 = uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
          (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
          (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
  if (this->convertor->need_conversion == false) {
    uVar3 = uVar2;
  }
  sVar5._M_state.__count = 0;
  sVar5._M_state.__value = (anon_union_4_2_91654ee9_for___value)0x0;
  sVar5._M_off = uVar3;
  sVar5 = address_translator::operator[](this->translator,sVar5);
  uVar2 = sVar5._M_off;
  iVar1 = (*(this->super_section)._vptr_section[0x13])(this);
  uVar3 = CONCAT44(extraout_var,iVar1);
  iVar1 = (*(this->super_section)._vptr_section[0x20])(this);
  if (CONCAT44(extraout_var_00,iVar1) < uVar2) {
    return false;
  }
  iVar1 = (*(this->super_section)._vptr_section[0x20])(this);
  if (CONCAT44(extraout_var_01,iVar1) < uVar3) {
    return false;
  }
  iVar1 = (*(this->super_section)._vptr_section[0x20])(this);
  if (uVar3 <= CONCAT44(extraout_var_02,iVar1) - uVar2) {
    bVar4 = true;
    if ((this->data)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
        super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
        super__Head_base<0UL,_char_*,_false>._M_head_impl == (char *)0x0) {
      this_00 = &this->data;
      iVar1 = (*(this->super_section)._vptr_section[5])(this);
      if ((iVar1 != 0) && (iVar1 = (*(this->super_section)._vptr_section[5])(this), iVar1 != 8)) {
        if (uVar3 == 0xffffffffffffffff) {
          return false;
        }
        __p = (pointer)operator_new__(uVar3 + 1,(nothrow_t *)&std::nothrow);
        std::__uniq_ptr_impl<char,_std::default_delete<char[]>_>::reset
                  ((__uniq_ptr_impl<char,_std::default_delete<char[]>_> *)this_00,__p);
        if (uVar3 == 0) {
          this->data_size = 0;
        }
        else {
          if ((this_00->_M_t).super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
              super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
              super__Head_base<0UL,_char_*,_false>._M_head_impl == (char *)0x0) {
            this->data_size = 0;
            return false;
          }
          std::istream::seekg(this->pstream,uVar2,0);
          std::istream::read((char *)this->pstream,
                             (long)(this->data)._M_t.
                                   super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                                   super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                                   super__Head_base<0UL,_char_*,_false>._M_head_impl);
          if (*(ulong *)(this->pstream + 8) != uVar3) {
            std::__uniq_ptr_impl<char,_std::default_delete<char[]>_>::reset
                      ((__uniq_ptr_impl<char,_std::default_delete<char[]>_> *)this_00,(pointer)0x0);
            this->data_size = 0;
            return false;
          }
          this->data_size = uVar3;
          (this->data)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
          super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
          super__Head_base<0UL,_char_*,_false>._M_head_impl[uVar3] = '\0';
        }
        this->is_loaded = true;
        return true;
      }
      if (((this_00->_M_t).super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
           super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
           super__Head_base<0UL,_char_*,_false>._M_head_impl == (char *)0x0) &&
         (iVar1 = (*(this->super_section)._vptr_section[5])(this), iVar1 != 0)) {
        iVar1 = (*(this->super_section)._vptr_section[5])(this);
        bVar4 = iVar1 == 8;
      }
    }
    this->is_loaded = bVar4;
    return bVar4;
  }
  return false;
}

Assistant:

bool load_data() const
    {
        Elf_Xword sh_offset = (*translator)[(*convertor)(header.sh_offset)];
        Elf_Xword size = get_size();
        
        // Check for integer overflow in offset calculation
        if (sh_offset > get_stream_size()) {
            return false;
        }
        
        // Check for integer overflow in size calculation
        if (size > get_stream_size() || 
            size > (get_stream_size() - sh_offset)) {
            return false;
        }

        // Check if we need to load data
        if (nullptr == data && SHT_NULL != get_type() && SHT_NOBITS != get_type()) {
            // Check if size can be safely converted to size_t
            if (size > std::numeric_limits<size_t>::max() - 1) {
                return false;
            }
            
            data.reset(new (std::nothrow) char[size_t(size) + 1]);

            if ((0 != size) && (nullptr != data)) {
                pstream->seekg(sh_offset);
                pstream->read(data.get(), size);
                if (static_cast<Elf_Xword>(pstream->gcount()) != size) {
                    data.reset(nullptr);
                    data_size = 0;
                    return false;
                }

                data_size = size;
                data.get()[size] = 0; // Safe now as we allocated size + 1
            }
            else {
                data_size = 0;
                if (size != 0) {
                    return false; // Failed to allocate required memory
                }
            }
            
            is_loaded = true;
            return true;
        }

        // Data already loaded or doesn't need loading
        is_loaded = (nullptr != data) || (SHT_NULL == get_type()) || (SHT_NOBITS == get_type());
        return is_loaded;
    }